

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O0

err_t cvcParseOptions(btok_cvc_t *cvc,bool_t *eid,bool_t *esign,cmd_pwd_t *pwd,octet *date,
                     int *readc,int argc,char **argv)

{
  int *piVar1;
  bool_t bVar2;
  int iVar3;
  size_t sVar4;
  long *in_RCX;
  int *in_RDX;
  int *in_RSI;
  cmd_pwd_t *in_RDI;
  char *in_R8;
  int *in_R9;
  err_t code;
  uint in_stack_ffffffffffffffc8;
  err_t eVar5;
  
  eVar5 = 0;
  if (in_RDI != (cmd_pwd_t *)0x0) {
    memSet(in_R9,'\0',0x10fc3c);
  }
  if (in_RSI != (int *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = 0;
  }
  if (in_RCX != (long *)0x0) {
    *in_RCX = 0;
  }
  if (in_R8 != (char *)0x0) {
    memSet(in_R9,(octet)(eVar5 >> 0x18),0x10fc9f);
  }
  *in_R9 = (uint)readc;
LAB_0010fcae:
  in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 & 0xffffff;
  if ((uint)readc != 0) {
    bVar2 = strStartsWith(*(char **)date,"-");
    in_stack_ffffffffffffffc8 = CONCAT13(bVar2 != 0,(int3)in_stack_ffffffffffffffc8);
  }
  piVar1 = readc;
  if ((char)(in_stack_ffffffffffffffc8 >> 0x18) == '\0') goto LAB_00110331;
  if ((int)(uint)readc < 2) {
    eVar5 = 0x25b;
LAB_00110331:
    readc._0_4_ = (uint)piVar1;
    if (((eVar5 == 0) && (in_RCX != (long *)0x0)) && (*in_RCX == 0)) {
      eVar5 = 0x25b;
    }
    if ((eVar5 == 0) || (in_RCX == (long *)0x0)) {
      *in_R9 = *in_R9 - (uint)readc;
    }
    else {
      cmdPwdClose((cmd_pwd_t)0x11036f);
      *in_RCX = 0;
    }
    return eVar5;
  }
  iVar3 = strCmp((char *)in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
  if (iVar3 == 0) {
    if (in_RDI == (cmd_pwd_t *)0x0) {
      eVar5 = 0x25b;
      goto LAB_00110331;
    }
    sVar4 = strLen((char *)0x10fd36);
    if (sVar4 != 0) {
      eVar5 = 0x25c;
      goto LAB_00110331;
    }
    sVar4 = strLen((char *)0x10fd6f);
    if ((sVar4 == 0) || (sVar4 = strLen((char *)0x10fd82), 0xd < sVar4 + 1)) {
      eVar5 = 0x135;
      piVar1 = (int *)(ulong)((uint)readc - 1);
      goto LAB_00110331;
    }
    strCopy((char *)in_RCX,in_R8);
  }
  else {
    iVar3 = strCmp((char *)in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
    if (iVar3 == 0) {
      if (in_RDI == (cmd_pwd_t *)0x0) {
        eVar5 = 0x25b;
        goto LAB_00110331;
      }
      sVar4 = strLen((char *)0x10fe09);
      if (sVar4 != 0) {
        eVar5 = 0x25c;
        goto LAB_00110331;
      }
      sVar4 = strLen((char *)0x10fe42);
      if ((sVar4 == 0) || (sVar4 = strLen((char *)0x10fe55), 0xd < sVar4 + 1)) {
        eVar5 = 0x135;
        piVar1 = (int *)(ulong)((uint)readc - 1);
        goto LAB_00110331;
      }
      strCopy((char *)in_RCX,in_R8);
    }
    else {
      iVar3 = strCmp((char *)in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
      if (iVar3 == 0) {
        if (in_RDI == (cmd_pwd_t *)0x0) {
          eVar5 = 0x25b;
          goto LAB_00110331;
        }
        bVar2 = memIsZero(in_RDI + 0x15,6);
        if (bVar2 == 0) {
          eVar5 = 0x25c;
          goto LAB_00110331;
        }
        eVar5 = cmdDateParse((octet *)CONCAT44(eVar5,in_stack_ffffffffffffffc8),(char *)0x10ff2c);
      }
      else {
        iVar3 = strCmp((char *)in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
        if (iVar3 != 0) {
          iVar3 = strCmp((char *)in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
          if (iVar3 == 0) {
            if ((in_RDI == (cmd_pwd_t *)0x0) || (in_RSI == (int *)0x0)) {
              eVar5 = 0x25b;
              goto LAB_00110331;
            }
            if (*in_RSI != 0) {
              eVar5 = 0x25c;
              goto LAB_00110331;
            }
            sVar4 = strLen((char *)0x11008b);
            if ((sVar4 != 10) ||
               (bVar2 = hexIsValid((char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8)), bVar2 == 0))
            {
              eVar5 = 0x137;
              piVar1 = (int *)(ulong)((uint)readc - 1);
              goto LAB_00110331;
            }
            hexTo(in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
            *in_RSI = 1;
          }
          else {
            iVar3 = strCmp((char *)in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
            if (iVar3 != 0) {
              iVar3 = strCmp((char *)in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
              if (iVar3 == 0) {
                if (in_RCX == (long *)0x0) {
                  eVar5 = 0x25b;
                  goto LAB_00110331;
                }
                if (*in_RCX != 0) {
                  eVar5 = 0x25c;
                  goto LAB_00110331;
                }
                eVar5 = cmdPwdRead(in_RDI,(char *)in_RSI);
              }
              else {
                iVar3 = strCmp((char *)in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
                if (iVar3 != 0) {
                  eVar5 = 0x25b;
                  goto LAB_00110331;
                }
                if (in_R8 == (char *)0x0) {
                  eVar5 = 0x25b;
                  goto LAB_00110331;
                }
                bVar2 = memIsZero(in_R8,6);
                if (bVar2 == 0) {
                  eVar5 = 0x25c;
                  goto LAB_00110331;
                }
                eVar5 = cmdDateParse((octet *)CONCAT44(eVar5,in_stack_ffffffffffffffc8),
                                     (char *)0x1102ec);
              }
              piVar1 = (int *)(ulong)((uint)readc - 1);
              if (eVar5 == 0) goto LAB_0011032c;
              goto LAB_00110331;
            }
            if ((in_RDI == (cmd_pwd_t *)0x0) || (in_RDX == (int *)0x0)) {
              eVar5 = 0x25b;
              goto LAB_00110331;
            }
            if (*in_RDX != 0) {
              eVar5 = 0x25c;
              goto LAB_00110331;
            }
            sVar4 = strLen((char *)0x110169);
            if ((sVar4 != 4) ||
               (bVar2 = hexIsValid((char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8)), bVar2 == 0))
            {
              eVar5 = 0x137;
              piVar1 = (int *)(ulong)((uint)readc - 1);
              goto LAB_00110331;
            }
            hexTo(in_R9,(char *)CONCAT44(eVar5,in_stack_ffffffffffffffc8));
            *in_RDX = 1;
          }
          goto LAB_0011032c;
        }
        if (in_RDI == (cmd_pwd_t *)0x0) {
          eVar5 = 0x25b;
          goto LAB_00110331;
        }
        bVar2 = memIsZero((void *)((long)in_RDI + 0xae),6);
        if (bVar2 == 0) {
          eVar5 = 0x25c;
          goto LAB_00110331;
        }
        eVar5 = cmdDateParse((octet *)CONCAT44(eVar5,in_stack_ffffffffffffffc8),(char *)0x10ffe6);
      }
      piVar1 = (int *)(ulong)((uint)readc - 1);
      if (eVar5 != 0) goto LAB_00110331;
    }
  }
LAB_0011032c:
  date = date + 0x10;
  readc._0_4_ = (uint)readc - 2;
  readc = (int *)(ulong)(uint)readc;
  goto LAB_0010fcae;
}

Assistant:

static err_t cvcParseOptions(btok_cvc_t* cvc, bool_t* eid, bool_t* esign, 
	cmd_pwd_t* pwd, octet date[6], int* readc, int argc, char* argv[])
{
	err_t code = ERR_OK;
	// pre
	ASSERT(memIsNullOrValid(cvc, sizeof(btok_cvc_t)));
	ASSERT(memIsNullOrValid(eid, sizeof(bool_t)));
	ASSERT(memIsNullOrValid(esign, sizeof(bool_t)));
	ASSERT(memIsNullOrValid(pwd, sizeof(cmd_pwd_t)));
	ASSERT(memIsNullOrValid(date, 6));
	ASSERT(memIsValid(readc, sizeof(int)));
	// подготовить выходные данные
	cvc ? memSetZero(cvc, sizeof(btok_cvc_t)) : 0;
	eid ? *eid = 0 : 0;
	esign ? *esign = 0 : 0;
	pwd ? *pwd = 0 : 0;
	date ? memSetZero(date, 6) : 0;
	// обработать опции
	*readc = argc;
	while (argc && strStartsWith(*argv, "-"))
	{
		if (argc < 2)
		{
			code = ERR_CMD_PARAMS;
			break;
		}
		// authority
		if (strEq(argv[0], "-authority"))
		{
			if (!cvc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (strLen(cvc->authority))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if (!strLen(*argv) || strLen(*argv) + 1 > sizeof(cvc->authority))
			{
				code = ERR_BAD_NAME;
				break;
			}
			strCopy(cvc->authority, *argv);
			--argc, ++argv;
		}
		// holder
		else if (strEq(argv[0], "-holder"))
		{
			if (!cvc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (strLen(cvc->holder))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if (!strLen(*argv) || strLen(*argv) + 1 > sizeof(cvc->holder))
			{
				code = ERR_BAD_NAME;
				break;
			}
			strCopy(cvc->holder, *argv);
			--argc, ++argv;
		}
		// from
		else if (strEq(*argv, "-from"))
		{
			if (!cvc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (!memIsZero(cvc->from, 6))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			code = cmdDateParse(cvc->from, *argv);
			if (code != ERR_OK)
				break;
			--argc, ++argv;
		}
		// until
		else if (strEq(*argv, "-until"))
		{
			if (!cvc)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (!memIsZero(cvc->until, 6))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			code = cmdDateParse(cvc->until, *argv);
			if (code != ERR_OK)
				break;
			--argc, ++argv;
		}
		// eid
		else if (strEq(*argv, "-eid"))
		{
			if (!cvc || !eid)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (*eid)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if (strLen(*argv) != 10 || !hexIsValid(*argv))
			{
				code = ERR_BAD_ACL;
				break;
			}
			hexTo(cvc->hat_eid, *argv);
			*eid = TRUE;
			--argc, ++argv;
		}
		// esign
		else if (strEq(*argv, "-esign"))
		{
			if (!cvc || !esign)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (*esign)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if (strLen(*argv) != 4 || !hexIsValid(*argv))
			{
				code = ERR_BAD_ACL;
				break;
			}
			hexTo(cvc->hat_esign, *argv);
			*esign = TRUE;
			--argc, ++argv;
		}
		// password
		else if (strEq(*argv, "-pass"))
		{
			if (!pwd)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (*pwd)
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			if ((code = cmdPwdRead(pwd, *argv)) != ERR_OK)
				break;
			--argc, ++argv;
		}
		// date
		else if (strEq(*argv, "-date"))
		{
			if (!date)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			if (!memIsZero(date, 6))
			{
				code = ERR_CMD_DUPLICATE;
				break;
			}
			--argc, ++argv;
			ASSERT(argc > 0);
			code = cmdDateParse(date, *argv);
			if (code != ERR_OK)
				break;
			--argc, ++argv;
		}
		else
		{
			code = ERR_CMD_PARAMS;
			break;
		}
	}
	// проверить, что запрошенные данные определены
	// \remark корректность cvc будет проверена позже
	// \remark параметр date не является обязательным
	if (code == ERR_OK && pwd && !*pwd)
		code = ERR_CMD_PARAMS;
	// завершить
	if (code != ERR_OK && pwd)
		cmdPwdClose(*pwd), *pwd = 0;
	else
		*readc -= argc;
	return code;
}